

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

void am_script_execute_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object script_execute_command;
  Am_Object script_window;
  Am_Object sel_widget;
  Am_Object undo_db;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)&local_30,10);
  Am_Object::~Am_Object(&local_30);
  pAVar1 = Am_Object::Get(&local_28,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&local_30,pAVar1);
  pAVar1 = Am_Object::Get(&local_28,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object(&local_10,pAVar1);
  pAVar1 = Am_Object::Get(&local_10,0x197,0);
  Am_Object::Am_Object(&local_18,pAVar1);
  Am_Execute_Command(&local_30,&local_18);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&local_28,(ulong)Am_EXECUTE_COUNTER);
  Am_Object::Set(&local_20,0x169,1,0);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_script_execute, (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Object sel_widget = undo_db.Get(Am_SELECTION_WIDGET);
  Am_INTER_TRACE_PRINT(cmd, "Executing script " << script_execute_command);
  Am_Execute_Command(script_execute_command, sel_widget);
  // leave script window visible
  script_window.Get_Object(Am_EXECUTE_COUNTER).Set(Am_VALUE, 1);
}